

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void NavierStokesBase::variableCleanUp(void)

{
  Projection *pPVar1;
  MacProj *pMVar2;
  
  amrex::DescriptorList::clear((DescriptorList *)amrex::AmrLevel::desc_lst);
  std::__cxx11::_List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::_M_clear
            ((_List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)
             &amrex::AmrLevel::derive_lst);
  pPVar1 = projector;
  _DAT_00817880 = &amrex::AmrLevel::derive_lst;
  amrex::AmrLevel::derive_lst = &amrex::AmrLevel::derive_lst;
  DAT_00817888 = 0;
  if (projector != (Projection *)0x0) {
    Projection::~Projection(projector);
  }
  operator_delete(pPVar1,0x68);
  pMVar2 = mac_projector;
  projector = (Projection *)0x0;
  if (mac_projector != (MacProj *)0x0) {
    MacProj::~MacProj(mac_projector);
  }
  operator_delete(pMVar2,0x60);
  mac_projector = (MacProj *)0x0;
  return;
}

Assistant:

void
NavierStokesBase::variableCleanUp ()
{
    desc_lst.clear();
    derive_lst.clear();

    delete projector;
    projector = nullptr;

    delete mac_projector;
    mac_projector = nullptr;

#ifdef AMREX_PARTICLES
    delete NSPC;
    NSPC = nullptr;
#endif
}